

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int read_char_literal(int pass,char delim)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  char *message;
  
  pcVar1 = lineptr + 1;
  cVar2 = *lineptr;
  uVar3 = (uint)cVar2;
  ecolumn = column + 1;
  if (uVar3 == 0) {
    ecolumn = column;
    message = "unterminated character or string literal";
    uVar3 = 0;
LAB_0010769f:
    column = ecolumn;
    err(E,message);
  }
  else {
    if (cVar2 == delim) {
      if (delim != '\'') {
        column = ecolumn;
        lineptr = pcVar1;
        return uVar3;
      }
      message = "empty character literal";
      lineptr = pcVar1;
      goto LAB_0010769f;
    }
    if (cVar2 != '\\') {
      column = ecolumn;
      lineptr = pcVar1;
      return uVar3;
    }
    pcVar1 = lineptr + 2;
    cVar2 = lineptr[1];
    column = column + 2;
    lineptr = pcVar1;
    ecolumn = column;
    switch(cVar2) {
    case '\\':
      uVar3 = 0x5c;
      break;
    case ']':
    case '^':
    case '_':
    case '`':
    case 'c':
    case 'd':
      goto switchD_001076ef_caseD_6f;
    case 'a':
      uVar3 = 7;
      break;
    case 'b':
      uVar3 = 8;
      break;
    case 'e':
      uVar3 = 0x1b;
      break;
    case 'f':
      uVar3 = 0xc;
      break;
    default:
      switch(cVar2) {
      case 'n':
        uVar3 = 10;
        break;
      case 'r':
        uVar3 = 0xd;
        break;
      case 't':
        uVar3 = 9;
        break;
      case 'v':
        uVar3 = 0xb;
        break;
      default:
        if (cVar2 == '\"') {
          return 0x22;
        }
        if (cVar2 == '\'') {
          return 0x27;
        }
        if (cVar2 == '?') {
          return 0x3f;
        }
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'u':
switchD_001076ef_caseD_6f:
        uVar3 = (uint)cVar2;
        if (pass == 1) {
          err(W,"unknown escape sequence \'\\%c\'",(ulong)uVar3);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int read_char_literal(int pass, char delim)
{
    int c = *lineptr++;
    ecolumn = ++column;
    if (!c)
    {
        --lineptr;
        ecolumn = --column;
        err(E, "unterminated character or string literal");
        return c;
    }
    if (c == delim)
    {
        if (delim == '\'')
            err(E, "empty character literal");
        return c;
    }

    if (c == '\\')
    {
        c = *lineptr++;
        ecolumn = ++column;
        switch (c)
        {
            case 'a': c = '\a'; break;
            case 'b': c = '\b'; break;
            case 'e': c = '\e'; break;
            case 'f': c = '\f'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 't': c = '\t'; break;
            case 'v': c = '\v'; break;
            case '\\': c = '\\'; break;
            case '\'': c = '\''; break;
            case '\"': c = '\"'; break;
            case '\?': c = '\?'; break;
            default:
                if (pass == READ_PASS)
                    err(W, "unknown escape sequence \'\\%c\'", c);
        }
    }
    return c;
}